

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptrlist.c
# Opt level: O0

void ptrlist_iter_split_current(ptr_list_iter *self)

{
  ptr_list_iter *self_local;
  
  if (((short)(char)*(undefined2 *)self->__list == N_) &&
     (ptrlist_split_node(self->__list), (int)(short)(char)*(undefined2 *)self->__list <= self->__nr)
     ) {
    self->__nr = self->__nr - (int)(short)(char)*(undefined2 *)self->__list;
    self->__list = self->__list->next_;
  }
  return;
}

Assistant:

void ptrlist_iter_split_current(struct ptr_list_iter *self)
{
	if (self->__list->nr_ == N_) {
		/* full so split */
		ptrlist_split_node(self->__list);
		if (self->__nr >= self->__list->nr_) {
			self->__nr -= self->__list->nr_;
			self->__list = self->__list->next_;
		}
	}
}